

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isValidForDPIArg(Type *this)

{
  bool bVar1;
  Type *this_00;
  iterator iVar2;
  reference ppFVar3;
  FieldSymbol *field;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3;
  Type *ct;
  FieldSymbol *in_stack_ffffffffffffffc8;
  Type *in_stack_ffffffffffffffd0;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffd8;
  
  this_00 = getCanonicalType(in_stack_ffffffffffffffd0);
  bVar1 = isIntegral(in_stack_ffffffffffffffd0);
  if ((((!bVar1) && (bVar1 = isFloating((Type *)0x49fcc0), !bVar1)) &&
      (bVar1 = isString((Type *)0x49fcce), !bVar1)) &&
     ((bVar1 = isCHandle((Type *)0x49fcdc), !bVar1 && (bVar1 = isVoid((Type *)0x49fcea), !bVar1))))
  {
    if (((this_00->super_Symbol).kind != FixedSizeUnpackedArrayType) &&
       ((this_00->super_Symbol).kind != DPIOpenArrayType)) {
      bVar1 = isUnpackedStruct((Type *)0x49fd35);
      if (!bVar1) {
        return false;
      }
      Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x49fd48);
      iVar2 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                        ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                         in_stack_ffffffffffffffc8);
      iVar2 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                        (iVar2._M_current);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                            *)iVar2._M_current,
                           (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffffc8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return true;
        }
        ppFVar3 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                  ::operator*((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                               *)&stack0xffffffffffffffd8);
        in_stack_ffffffffffffffc8 = *ppFVar3;
        ValueSymbol::getType((ValueSymbol *)0x49fda2);
        bVar1 = isValidForDPIArg(this_00);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
        ::operator++((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffd8);
      }
      return false;
    }
    getArrayElementType((Type *)in_stack_ffffffffffffffd8._M_current);
    bVar1 = isValidForDPIArg(this_00);
    return bVar1;
  }
  return true;
}

Assistant:

bool Type::isValidForDPIArg() const {
    auto& ct = getCanonicalType();
    if (ct.isIntegral() || ct.isFloating() || ct.isString() || ct.isCHandle() || ct.isVoid())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType ||
        ct.kind == SymbolKind::DPIOpenArrayType) {
        return ct.getArrayElementType()->isValidForDPIArg();
    }

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!field->getType().isValidForDPIArg())
                return false;
        }
        return true;
    }

    return false;
}